

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SetClipboardTextFn_DefaultImpl(void *param_1,char *text)

{
  char *pcVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  size_t __n;
  char *__dest;
  int iVar4;
  int iVar5;
  
  pIVar3 = GImGui;
  pcVar1 = (GImGui->PrivateClipboard).Data;
  if (pcVar1 != (char *)0x0) {
    (pIVar3->PrivateClipboard).Size = 0;
    (pIVar3->PrivateClipboard).Capacity = 0;
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(pcVar1,GImAllocatorUserData);
    (pIVar3->PrivateClipboard).Data = (char *)0x0;
  }
  __n = strlen(text);
  uVar2 = (uint)__n;
  iVar4 = uVar2 + 1;
  iVar5 = (pIVar3->PrivateClipboard).Capacity;
  if ((int)uVar2 < iVar5) {
    __dest = (char *)0x0;
  }
  else {
    if (iVar5 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar5 / 2 + iVar5;
    }
    if (iVar5 <= iVar4) {
      iVar5 = iVar4;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar5,GImAllocatorUserData);
    pcVar1 = (pIVar3->PrivateClipboard).Data;
    if (pcVar1 != (char *)0x0) {
      memcpy(__dest,pcVar1,(long)(pIVar3->PrivateClipboard).Size);
      pcVar1 = (pIVar3->PrivateClipboard).Data;
      if (pcVar1 != (char *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pcVar1,GImAllocatorUserData);
    }
    (pIVar3->PrivateClipboard).Data = __dest;
    (pIVar3->PrivateClipboard).Capacity = iVar5;
  }
  (pIVar3->PrivateClipboard).Size = iVar4;
  if (-1 < (int)uVar2) {
    memcpy(__dest,text,__n);
    if ((int)uVar2 < (pIVar3->PrivateClipboard).Size) {
      (pIVar3->PrivateClipboard).Data[uVar2 & 0x7fffffff] = '\0';
      return;
    }
  }
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4c0,"value_type &ImVector<char>::operator[](int) [T = char]");
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(void*, const char* text)
{
    ImGuiContext& g = *GImGui;
    g.PrivateClipboard.clear();
    const char* text_end = text + strlen(text);
    g.PrivateClipboard.resize((int)(text_end - text) + 1);
    memcpy(&g.PrivateClipboard[0], text, (size_t)(text_end - text));
    g.PrivateClipboard[(int)(text_end - text)] = 0;
}